

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_restore(DisasContext_conflict6 *ctx,uint8_t rt,uint8_t count,uint8_t gp,uint16_t u)

{
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  TCGv_i64 addr;
  TCGv_i64 val;
  undefined7 in_register_00000011;
  int iVar2;
  int u_00;
  int offset;
  undefined6 in_register_00000082;
  uint uVar3;
  uint reg;
  ulong uVar4;
  
  uVar3 = (uint)rt;
  uVar4 = CONCAT71(in_register_00000011,count) & 0xffffffff;
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  val = tcg_temp_new_i64(tcg_ctx);
  u_00 = (int)CONCAT62(in_register_00000082,u);
  offset = u_00;
  while( true ) {
    offset = offset + -4;
    iVar2 = (int)uVar4;
    if (iVar2 == 0) break;
    uVar1 = uVar3 & 0x1f | rt & 0x10;
    reg = uVar1;
    if (iVar2 == 1) {
      reg = 0x1c;
    }
    if (gp == '\0') {
      reg = uVar1;
    }
    gen_base_offset_addr(ctx,addr,0x1d,offset);
    tcg_gen_qemu_ld_i64_mips64el
              (tcg_ctx,val,addr,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_LESL);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,val,val);
    gen_store_gpr(tcg_ctx,val,reg);
    uVar3 = uVar3 + 1;
    uVar4 = (ulong)(iVar2 - 1);
  }
  gen_adjust_sp(ctx,u_00);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_restore(DisasContext *ctx, uint8_t rt, uint8_t count,
                        uint8_t gp, uint16_t u)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int counter = 0;
    TCGv va = tcg_temp_new(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);

    while (counter != count) {
        bool use_gp = gp && (counter == count - 1);
        int this_rt = use_gp ? 28 : (rt & 0x10) | ((rt + counter) & 0x1f);
        int this_offset = u - ((counter + 1) << 2);
        gen_base_offset_addr(ctx, va, 29, this_offset);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, va, ctx->mem_idx, MO_TESL |
                        ctx->default_tcg_memop_mask);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        gen_store_gpr(tcg_ctx, t0, this_rt);
        counter++;
    }

    /* adjust stack pointer */
    gen_adjust_sp(ctx, u);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, va);
}